

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::mapped_string::~mapped_string(mapped_string *this)

{
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&this->str);
  return;
}

Assistant:

~mapped_string() = default;